

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O1

void __thiscall despot::POMDPX::PrintDefaultActions(POMDPX *this)

{
  uint uVar1;
  ostream *poVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  vector<int,_std::allocator<int>_> local_48;
  
  uVar1 = (*(this->super_MDP)._vptr_MDP[2])();
  if (0 < (int)uVar1) {
    lVar5 = 0;
    lVar4 = 0;
    iVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"s = ",4);
      poVar2 = (ostream *)std::ostream::operator<<(&std::cout,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_48,
                 (vector<int,_std::allocator<int>_> *)
                 (*(long *)((long)(this->states_).
                                  super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar4 * 2) + 0x20));
      poVar2 = despot::operator<<(poVar2,&local_48);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      poVar2 = despot::operator<<(poVar2,(ValuedAction *)
                                         ((long)&((this->super_MDP).policy_.
                                                  super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->action
                                         + lVar5));
      std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      (*(this->super_MDP)._vptr_MDP[0x15])
                (this,*(undefined8 *)
                       ((long)(this->states_).
                              super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar4 * 2),&std::cout);
      iVar3 = iVar3 + 1;
      lVar4 = lVar4 + 4;
      lVar5 = lVar5 + 0x10;
    } while ((ulong)uVar1 << 4 != lVar5);
  }
  return;
}

Assistant:

void POMDPX::PrintDefaultActions() {
	int num_states = NumStates();
	for (int s = 0; s < num_states; s++) {
		cout << "s = " << s << " " << states_[s]->vec_id << " " << policy_[s]
			<< endl;
		PrintState(*states_[s]);
	}
}